

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# promises.cpp
# Opt level: O3

shared_ptr<SchemeObject> make_promise(shared_ptr<ASTNode> *body,Context *context)

{
  _List_node_base *p_Var1;
  element_type *peVar2;
  element_type *extraout_RAX;
  element_type *extraout_RAX_00;
  element_type *peVar3;
  undefined8 *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  shared_ptr<SchemeObject> sVar5;
  shared_ptr<SchemeCompoundProcedure> f;
  undefined1 local_79;
  shared_ptr<SchemeCompoundProcedure> local_78;
  element_type *local_68;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_60 [2];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> local_50;
  _List_base<std::shared_ptr<ASTNode>,_std::allocator<std::shared_ptr<ASTNode>_>_> local_40;
  undefined1 local_28 [8];
  
  local_78.super___shared_ptr<SchemeCompoundProcedure,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<SchemeCompoundProcedure,std::allocator<SchemeCompoundProcedure>>
            (&local_78.super___shared_ptr<SchemeCompoundProcedure,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(SchemeCompoundProcedure **)&local_78,
             (allocator<SchemeCompoundProcedure> *)&local_68);
  peVar2 = local_78.super___shared_ptr<SchemeCompoundProcedure,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (&(local_78.super___shared_ptr<SchemeCompoundProcedure,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
       context != (Context *)in_RDX) {
    std::__cxx11::
    list<std::shared_ptr<std::map<std::__cxx11::string,std::shared_ptr<SchemeObject>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<SchemeObject>>>>>,std::allocator<std::shared_ptr<std::map<std::__cxx11::string,std::shared_ptr<SchemeObject>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<SchemeObject>>>>>>>
    ::
    _M_assign_dispatch<std::_List_const_iterator<std::shared_ptr<std::map<std::__cxx11::string,std::shared_ptr<SchemeObject>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<SchemeObject>>>>>>>
              ((list<std::shared_ptr<std::map<std::__cxx11::string,std::shared_ptr<SchemeObject>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<SchemeObject>>>>>,std::allocator<std::shared_ptr<std::map<std::__cxx11::string,std::shared_ptr<SchemeObject>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<SchemeObject>>>>>>>
                *)&(local_78.super___shared_ptr<SchemeCompoundProcedure,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr)->context,*in_RDX);
  }
  (peVar2->context).toplevel = *(bool *)(in_RDX + 3);
  p_Var1 = (context->locals).
           super__List_base<std::shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<SchemeObject>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<SchemeObject>_>_>_>_>,_std::allocator<std::shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<SchemeObject>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<SchemeObject>_>_>_>_>_>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  local_68 = (element_type *)CONCAT44(local_68._4_4_,*(undefined4 *)&p_Var1->_M_next);
  a_Stack_60[0]._M_pi = &local_50;
  std::__cxx11::string::_M_construct<char*>
            ((string *)a_Stack_60,p_Var1->_M_prev,
             (long)&p_Var1->_M_prev->_M_next + (long)p_Var1[1]._M_next);
  std::__cxx11::list<std::shared_ptr<ASTNode>,_std::allocator<std::shared_ptr<ASTNode>_>_>::list
            ((list<std::shared_ptr<ASTNode>,_std::allocator<std::shared_ptr<ASTNode>_>_> *)&local_40
             ,(list<std::shared_ptr<ASTNode>,_std::allocator<std::shared_ptr<ASTNode>_>_> *)
              ((long)(p_Var1 + 2) + 8));
  std::__cxx11::list<ASTNode,std::allocator<ASTNode>>::_M_assign_dispatch<ASTNode_const*>
            ((list<ASTNode,std::allocator<ASTNode>> *)
             &(local_78.super___shared_ptr<SchemeCompoundProcedure,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->body,&local_68,local_28);
  std::__cxx11::_List_base<std::shared_ptr<ASTNode>,_std::allocator<std::shared_ptr<ASTNode>_>_>::
  _M_clear(&local_40);
  if (a_Stack_60[0]._M_pi != &local_50) {
    operator_delete(a_Stack_60[0]._M_pi,(long)local_50._vptr__Sp_counted_base + 1);
  }
  local_68 = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<SchemePromise,std::allocator<SchemePromise>,std::shared_ptr<SchemeCompoundProcedure>&>
            (a_Stack_60,(SchemePromise **)&local_68,(allocator<SchemePromise> *)&local_79,&local_78)
  ;
  (body->super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = local_68;
  (body->super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       a_Stack_60[0]._M_pi;
  peVar3 = extraout_RAX;
  _Var4._M_pi = extraout_RDX;
  if (local_78.super___shared_ptr<SchemeCompoundProcedure,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.super___shared_ptr<SchemeCompoundProcedure,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
    peVar3 = extraout_RAX_00;
    _Var4._M_pi = extraout_RDX_00;
  }
  sVar5.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var4._M_pi
  ;
  sVar5.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar3;
  return (shared_ptr<SchemeObject>)
         sVar5.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static std::shared_ptr<SchemeObject> make_promise(std::shared_ptr<ASTNode> body, const Context &context)
{
    auto f = std::make_shared<SchemeCompoundProcedure>();
    f->context = context;
    f->body = {*body};
    return std::make_shared<SchemePromise>(f);
}